

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

void Aig_RManTableResize(Aig_RMan_t *p)

{
  uint uVar1;
  Aig_Tru_t **__ptr;
  uint uVar2;
  Aig_Tru_t **ppAVar3;
  Aig_Tru_t *pAVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  Aig_Tru_t *pAVar9;
  Aig_Tru_t *pAVar10;
  bool bVar11;
  timespec ts;
  timespec local_40;
  
  if (p->pBins == (Aig_Tru_t **)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCanon.c"
                  ,0xb4,"void Aig_RManTableResize(Aig_RMan_t *)");
  }
  clock_gettime(3,&local_40);
  __ptr = p->pBins;
  uVar1 = p->nBins;
  uVar5 = uVar1 * 3 - 1;
  while( true ) {
    do {
      uVar6 = uVar5 + 1;
      uVar2 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar2 != 0);
    if (uVar6 < 9) break;
    iVar7 = 5;
    while (uVar6 % (iVar7 - 2U) != 0) {
      uVar2 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (uVar6 < uVar2) goto LAB_006ac76f;
    }
  }
LAB_006ac76f:
  p->nBins = uVar6;
  ppAVar3 = (Aig_Tru_t **)calloc((long)(int)uVar6,8);
  p->pBins = ppAVar3;
  if ((int)uVar1 < 1) {
    iVar7 = 0;
  }
  else {
    uVar8 = 0;
    iVar7 = 0;
    do {
      pAVar9 = __ptr[uVar8];
      if (pAVar9 != (Aig_Tru_t *)0x0) {
        pAVar10 = pAVar9->pNext;
        do {
          ppAVar3 = Aig_RManTableLookup(p,(uint *)(pAVar9 + 1),*(uint *)&pAVar9->field_0xc >> 0x1b);
          if (*ppAVar3 != (Aig_Tru_t *)0x0) {
            __assert_fail("*ppPlace == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCanon.c"
                          ,0xc4,"void Aig_RManTableResize(Aig_RMan_t *)");
          }
          *ppAVar3 = pAVar9;
          pAVar9->pNext = (Aig_Tru_t *)0x0;
          if (pAVar10 == (Aig_Tru_t *)0x0) {
            pAVar4 = (Aig_Tru_t *)0x0;
          }
          else {
            pAVar4 = pAVar10->pNext;
          }
          iVar7 = iVar7 + 1;
          bVar11 = pAVar10 != (Aig_Tru_t *)0x0;
          pAVar9 = pAVar10;
          pAVar10 = pAVar4;
        } while (bVar11);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  if (iVar7 == p->nEntries) {
    if (__ptr != (Aig_Tru_t **)0x0) {
      free(__ptr);
    }
    return;
  }
  __assert_fail("Counter == p->nEntries",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigCanon.c"
                ,0xca,"void Aig_RManTableResize(Aig_RMan_t *)");
}

Assistant:

void Aig_RManTableResize( Aig_RMan_t * p )
{
    Aig_Tru_t * pEntry, * pNext;
    Aig_Tru_t ** pBinsOld, ** ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = pBinsOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the Bins 
        ppPlace = Aig_RManTableLookup( p, pEntry->pTruth, pEntry->nVars );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == p->nEntries );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    ABC_FREE( pBinsOld );
}